

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Op __thiscall spv::Builder::getMostBasicTypeClass(Builder *this,Id typeId)

{
  Instruction *pIVar1;
  ulong uVar2;
  uint *puVar3;
  
  uVar2 = (ulong)typeId;
  do {
    pIVar1 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2];
    uVar2 = (ulong)pIVar1->opCode;
    if (0x20 < uVar2) {
LAB_001b6f1b:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                    ,0x25f,"Op spv::Builder::getMostBasicTypeClass(Id) const");
    }
    if ((0x31800000UL >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 != 0x20) {
        if ((0x40780000UL >> (uVar2 & 0x3f) & 1) != 0) {
          return pIVar1->opCode;
        }
        goto LAB_001b6f1b;
      }
      puVar3 = (uint *)(*(long *)&(pIVar1->operands).
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  ._M_impl.super__Vector_impl_data + 4);
    }
    else {
      puVar3 = (pIVar1->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar2 = (ulong)*puVar3;
  } while( true );
}

Assistant:

Op Builder::getMostBasicTypeClass(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    Op typeClass = instr->getOpCode();
    switch (typeClass)
    {
    case OpTypeVoid:
    case OpTypeBool:
    case OpTypeInt:
    case OpTypeFloat:
    case OpTypeStruct:
        return typeClass;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return getMostBasicTypeClass(instr->getIdOperand(0));
    case OpTypePointer:
        return getMostBasicTypeClass(instr->getIdOperand(1));
    default:
        assert(0);
        return OpTypeFloat;
    }
}